

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O1

void __thiscall
asio::io_context::basic_executor_type<std::allocator<void>,_4UL>::
execute<asio::detail::executor_function>
          (basic_executor_type<std::allocator<void>,_4UL> *this,executor_function *f)

{
  long *plVar1;
  impl_base *piVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  ptr local_28;
  
  if (((this->target_ & 1) == 0) &&
     (plVar1 = *(long **)(in_FS_OFFSET + -0x10), plVar1 != (long *)0x0)) {
    do {
      if (*plVar1 == *(long *)((this->target_ & 0xfffffffffffffffc) + 8)) {
        if (plVar1[1] != 0) {
          piVar2 = f->impl_;
          f->impl_ = (impl_base *)0x0;
          if (piVar2 != (impl_base *)0x0) {
            (*piVar2->complete_)(piVar2,true);
            piVar2 = (impl_base *)0x0;
          }
          if (piVar2 == (impl_base *)0x0) {
            return;
          }
          (*piVar2->complete_)(piVar2,false);
          return;
        }
        break;
      }
      plVar1 = (long *)plVar1[2];
    } while (plVar1 != (long *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -0x10) + 8);
  }
  local_28.a = (allocator<void> *)this;
  local_28.v = detail::thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                         (uVar3,0x28,8);
  (((executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
     *)local_28.v)->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
  (((executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
     *)local_28.v)->super_scheduler_operation).func_ =
       detail::
       executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
       ::do_complete;
  (((executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
     *)local_28.v)->super_scheduler_operation).task_result_ = 0;
  (((executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
     *)local_28.v)->handler_).impl_ = f->impl_;
  f->impl_ = (impl_base *)0x0;
  local_28.p = (executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
                *)local_28.v;
  detail::scheduler::post_immediate_completion
            (*(scheduler **)((this->target_ & 0xfffffffffffffffc) + 8),(operation *)local_28.v,
             SUB41(((uint)this->target_ & 2) >> 1,0));
  local_28.v = (void *)0x0;
  local_28.p = (executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
                *)0x0;
  detail::
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  ::ptr::reset(&local_28);
  return;
}

Assistant:

void io_context::basic_executor_type<Allocator, Bits>::execute(
    ASIO_MOVE_ARG(Function) f) const
{
  typedef typename decay<Function>::type function_type;

  // Invoke immediately if the blocking.possibly property is enabled and we are
  // already inside the thread pool.
  if ((bits() & blocking_never) == 0 && context_ptr()->impl_.can_dispatch())
  {
    // Make a local, non-const copy of the function.
    function_type tmp(ASIO_MOVE_CAST(Function)(f));

#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    try
    {
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
      detail::fenced_block b(detail::fenced_block::full);
      asio_handler_invoke_helpers::invoke(tmp, tmp);
      return;
#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    }
    catch (...)
    {
      context_ptr()->impl_.capture_current_exception();
      return;
    }
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       //   && !defined(ASIO_NO_EXCEPTIONS)
  }

  // Allocate and construct an operation to wrap the function.
  typedef detail::executor_op<function_type, Allocator, detail::operation> op;
  typename op::ptr p = {
      detail::addressof(static_cast<const Allocator&>(*this)),
      op::ptr::allocate(static_cast<const Allocator&>(*this)), 0 };
  p.p = new (p.v) op(ASIO_MOVE_CAST(Function)(f),
      static_cast<const Allocator&>(*this));

  ASIO_HANDLER_CREATION((*context_ptr(), *p.p,
        "io_context", context_ptr(), 0, "execute"));

  context_ptr()->impl_.post_immediate_completion(p.p,
      (bits() & relationship_continuation) != 0);
  p.v = p.p = 0;
}